

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbify.cc
# Opt level: O3

void do_actual_learning_ldf<false>(cbify *data,multi_learner *base,multi_ex *ec_seq)

{
  vector<v_array<CB::cb_class>,_std::allocator<v_array<CB::cb_class>_>_> *this;
  vector<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
  *this_00;
  label_t *plVar1;
  undefined8 *puVar2;
  cb_class **ppcVar3;
  example *peVar4;
  pointer pvVar5;
  pointer pvVar6;
  size_t sVar7;
  action_score *paVar8;
  float fVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  label_t lVar13;
  label_t lVar14;
  float *pfVar15;
  float *pfVar16;
  cb_class *pcVar17;
  wclass *pwVar18;
  multi_learner *pmVar19;
  cbify *this_01;
  int iVar20;
  float fVar21;
  uint uVar22;
  pointer ppeVar23;
  vw_exception *pvVar24;
  pointer ppeVar25;
  pointer pvVar26;
  multi_ex *__range1;
  ulong uVar27;
  cbify *pcVar28;
  long lVar29;
  bool bVar30;
  float fVar31;
  uint32_t chosen_action;
  cb_class cl;
  stringstream __msg;
  uint local_224;
  cb_class local_220;
  multi_learner *local_210;
  cbify *local_208;
  multi_ex *local_200;
  string local_1f8;
  string local_1d8;
  pointer_____offset_0x10___ *local_1b8;
  float *local_1b0;
  ostream local_1a8;
  
  ppeVar23 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
             super__Vector_impl_data._M_start;
  ppeVar25 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  uVar27 = (long)ppeVar25 - (long)ppeVar23 >> 3;
  local_210 = base;
  if ((ulong)((long)(data->cs_costs).
                    super__Vector_base<v_array<COST_SENSITIVE::wclass>,_std::allocator<v_array<COST_SENSITIVE::wclass>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(data->cs_costs).
                    super__Vector_base<v_array<COST_SENSITIVE::wclass>,_std::allocator<v_array<COST_SENSITIVE::wclass>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5) < uVar27) {
    std::vector<v_array<COST_SENSITIVE::wclass>,_std::allocator<v_array<COST_SENSITIVE::wclass>_>_>
    ::resize(&data->cs_costs,uVar27);
    ppeVar23 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
               super__Vector_impl_data._M_start;
    ppeVar25 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    uVar27 = (long)ppeVar25 - (long)ppeVar23 >> 3;
  }
  this = &data->cb_costs;
  if ((ulong)((long)(data->cb_costs).
                    super__Vector_base<v_array<CB::cb_class>,_std::allocator<v_array<CB::cb_class>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(data->cb_costs).
                    super__Vector_base<v_array<CB::cb_class>,_std::allocator<v_array<CB::cb_class>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5) < uVar27) {
    std::vector<v_array<CB::cb_class>,_std::allocator<v_array<CB::cb_class>_>_>::resize(this,uVar27)
    ;
    ppeVar23 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
               super__Vector_impl_data._M_start;
    ppeVar25 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    uVar27 = (long)ppeVar25 - (long)ppeVar23 >> 3;
  }
  this_00 = &data->cb_as;
  local_208 = data;
  if ((ulong)((long)(data->cb_as).
                    super__Vector_base<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(data->cb_as).
                    super__Vector_base<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5) < uVar27) {
    std::
    vector<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
    ::resize(this_00,uVar27);
    ppeVar23 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
               super__Vector_impl_data._M_start;
    ppeVar25 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
               super__Vector_impl_data._M_finish;
  }
  if (ppeVar25 != ppeVar23) {
    lVar29 = 0;
    uVar27 = 0;
    local_200 = ec_seq;
    do {
      peVar4 = ppeVar23[uVar27];
      pvVar26 = (data->cs_costs).
                super__Vector_base<v_array<COST_SENSITIVE::wclass>,_std::allocator<v_array<COST_SENSITIVE::wclass>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar13 = (peVar4->l).multi;
      lVar14 = (label_t)(peVar4->l).cs.costs._end;
      sVar7 = (peVar4->l).cs.costs.erase_count;
      puVar2 = (undefined8 *)((long)&pvVar26->end_array + lVar29);
      *puVar2 = (peVar4->l).cs.costs.end_array;
      puVar2[1] = sVar7;
      plVar1 = (label_t *)((long)&pvVar26->_begin + lVar29);
      *plVar1 = lVar13;
      plVar1[1] = lVar14;
      v_array<CB::cb_class>::clear
                ((v_array<CB::cb_class> *)
                 ((long)&((this->
                          super__Vector_base<v_array<CB::cb_class>,_std::allocator<v_array<CB::cb_class>_>_>
                          )._M_impl.super__Vector_impl_data._M_start)->_begin + lVar29));
      v_array<ACTION_SCORE::action_score>::clear
                ((v_array<ACTION_SCORE::action_score> *)
                 ((long)&((this_00->
                          super__Vector_base<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
                          )._M_impl.super__Vector_impl_data._M_start)->_begin + lVar29));
      pvVar5 = (this->
               super__Vector_base<v_array<CB::cb_class>,_std::allocator<v_array<CB::cb_class>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
      plVar1 = (label_t *)((long)&pvVar5->_begin + lVar29);
      lVar13 = *plVar1;
      lVar14 = plVar1[1];
      puVar2 = (undefined8 *)((long)&pvVar5->end_array + lVar29);
      sVar7 = puVar2[1];
      (peVar4->l).cs.costs.end_array = (wclass *)*puVar2;
      (peVar4->l).cs.costs.erase_count = sVar7;
      (peVar4->l).multi = lVar13;
      (peVar4->l).cs.costs._end = (wclass *)lVar14;
      pvVar6 = (this_00->
               super__Vector_base<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      puVar2 = (undefined8 *)((long)&pvVar6->_begin + lVar29);
      pfVar15 = (float *)*puVar2;
      pfVar16 = (float *)puVar2[1];
      puVar2 = (undefined8 *)((long)&pvVar6->end_array + lVar29);
      sVar7 = puVar2[1];
      (peVar4->pred).scalars.end_array = (float *)*puVar2;
      (peVar4->pred).scalars.erase_count = sVar7;
      (peVar4->pred).scalars._begin = pfVar15;
      (peVar4->pred).scalars._end = pfVar16;
      uVar27 = uVar27 + 1;
      ppeVar23 = (local_200->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      lVar29 = lVar29 + 0x20;
      ec_seq = local_200;
    } while (uVar27 < (ulong)((long)(local_200->
                                    super__Vector_base<example_*,_std::allocator<example_*>_>).
                                    _M_impl.super__Vector_impl_data._M_finish - (long)ppeVar23 >> 3)
            );
  }
  pmVar19 = local_210;
  (**(code **)(local_210 + 0x30))
            (*(undefined8 *)(local_210 + 0x18),*(undefined8 *)(local_210 + 0x20),ec_seq);
  this_01 = local_208;
  peVar4 = *(ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  sVar7 = local_208->example_counter;
  local_208->example_counter = sVar7 + 1;
  local_1b0 = (peVar4->pred).scalars._begin;
  local_220._8_8_ = *(undefined8 *)((long)&peVar4->pred + 8);
  local_1b8 = &std::iterator<std::random_access_iterator_tag,float,long,float*,float>::typeinfo;
  local_220._0_8_ =
       &std::iterator<std::random_access_iterator_tag,float,long,float*,float>::typeinfo;
  iVar20 = exploration::sample_after_normalizing<ACTION_SCORE::score_iterator>
                     (sVar7 + local_208->app_seed,&local_1b8,&local_220,&local_224);
  if (iVar20 != 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>(&local_1a8,"Failed to sample from pdf",0x19);
    pvVar24 = (vw_exception *)__cxa_allocate_exception(0x38);
    std::__cxx11::stringbuf::str();
    VW::vw_exception::vw_exception
              (pvVar24,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/cbify.cc"
               ,0x117,&local_1d8);
    __cxa_throw(pvVar24,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  paVar8 = (peVar4->pred).a_s._begin;
  fVar21 = (float)(paVar8[local_224].action + 1);
  local_220.action = (uint32_t)fVar21;
  local_220.probability = paVar8[local_224].score;
  if (fVar21 == 0.0) {
    std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              (&local_1a8,"No action with non-zero probability found!",0x2a);
    pvVar24 = (vw_exception *)__cxa_allocate_exception(0x38);
    std::__cxx11::stringbuf::str();
    VW::vw_exception::vw_exception
              (pvVar24,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/cbify.cc"
               ,0x11e,&local_1f8);
    __cxa_throw(pvVar24,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  pvVar26 = (this_01->cs_costs).
            super__Vector_base<v_array<COST_SENSITIVE::wclass>,_std::allocator<v_array<COST_SENSITIVE::wclass>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  fVar31 = 0.0;
  do {
    if (pvVar26 ==
        (this_01->cs_costs).
        super__Vector_base<v_array<COST_SENSITIVE::wclass>,_std::allocator<v_array<COST_SENSITIVE::wclass>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
LAB_001c544a:
      local_220.cost = (this_01->loss1 - this_01->loss0) * fVar31 + this_01->loss0;
      v_array<CB::cb_class>::clear((v_array<CB::cb_class> *)this_01);
      v_array<CB::cb_class>::push_back((v_array<CB::cb_class> *)this_01,&local_220);
      uVar22 = local_220.action - 1;
      peVar4 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
               super__Vector_impl_data._M_start[uVar22];
      pvVar5 = (this_01->cb_costs).
               super__Vector_base<v_array<CB::cb_class>,_std::allocator<v_array<CB::cb_class>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      lVar13 = (peVar4->l).multi;
      pcVar17 = (cb_class *)(peVar4->l).cs.costs._end;
      sVar7 = (peVar4->l).cs.costs.erase_count;
      ppcVar3 = &pvVar5[uVar22].end_array;
      *ppcVar3 = (cb_class *)(peVar4->l).cs.costs.end_array;
      ppcVar3[1] = (cb_class *)sVar7;
      pvVar5 = pvVar5 + uVar22;
      pvVar5->_begin = (cb_class *)lVar13;
      pvVar5->_end = pcVar17;
      peVar4 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
               super__Vector_impl_data._M_start[uVar22];
      fVar21 = *(float *)&(this_01->cb_label).costs._begin;
      fVar31 = *(float *)((long)&(this_01->cb_label).costs._begin + 4);
      fVar9 = *(float *)&(this_01->cb_label).costs._end;
      uVar10 = *(undefined4 *)((long)&(this_01->cb_label).costs._end + 4);
      uVar11 = *(undefined4 *)((long)&(this_01->cb_label).costs.end_array + 4);
      sVar7 = (this_01->cb_label).costs.erase_count;
      uVar12 = *(undefined4 *)((long)&(this_01->cb_label).costs.erase_count + 4);
      *(undefined4 *)((long)&peVar4->l + 0x10) = *(undefined4 *)&(this_01->cb_label).costs.end_array
      ;
      *(undefined4 *)((long)&peVar4->l + 0x14) = uVar11;
      *(int *)((long)&peVar4->l + 0x18) = (int)sVar7;
      *(undefined4 *)((long)&peVar4->l + 0x1c) = uVar12;
      (peVar4->l).simple.label = fVar21;
      (peVar4->l).simple.weight = fVar31;
      (peVar4->l).simple.initial = fVar9;
      *(undefined4 *)((long)&peVar4->l + 0xc) = uVar10;
      (**(code **)(pmVar19 + 0x28))
                (*(undefined8 *)(pmVar19 + 0x18),*(undefined8 *)(pmVar19 + 0x20),ec_seq);
      ppeVar25 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      if (ppeVar25 !=
          (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
          super__Vector_impl_data._M_finish) {
        lVar29 = 0;
        uVar27 = 0;
        do {
          peVar4 = ppeVar25[uVar27];
          pvVar6 = (this_01->cb_as).
                   super__Vector_base<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pfVar15 = (peVar4->pred).scalars._begin;
          pfVar16 = (peVar4->pred).scalars._end;
          sVar7 = (peVar4->pred).scalars.erase_count;
          puVar2 = (undefined8 *)((long)&pvVar6->end_array + lVar29);
          *puVar2 = (peVar4->pred).scalars.end_array;
          puVar2[1] = sVar7;
          puVar2 = (undefined8 *)((long)&pvVar6->_begin + lVar29);
          *puVar2 = pfVar15;
          puVar2[1] = pfVar16;
          bVar30 = local_220.action - 1 == uVar27;
          pcVar28 = (cbify *)((long)&((this_01->cb_costs).
                                      super__Vector_base<v_array<CB::cb_class>,_std::allocator<v_array<CB::cb_class>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->_begin + lVar29);
          if (bVar30) {
            pcVar28 = this_01;
          }
          fVar21 = 0.0;
          if (bVar30) {
            fVar21 = (float)local_220.action;
          }
          lVar13 = (peVar4->l).multi;
          pcVar17 = (cb_class *)(peVar4->l).cs.costs._end;
          sVar7 = (peVar4->l).cs.costs.erase_count;
          (pcVar28->cb_label).costs.end_array = (cb_class *)(peVar4->l).cs.costs.end_array;
          (pcVar28->cb_label).costs.erase_count = sVar7;
          (pcVar28->cb_label).costs._begin = (cb_class *)lVar13;
          (pcVar28->cb_label).costs._end = pcVar17;
          pvVar26 = (this_01->cs_costs).
                    super__Vector_base<v_array<COST_SENSITIVE::wclass>,_std::allocator<v_array<COST_SENSITIVE::wclass>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          plVar1 = (label_t *)((long)&pvVar26->_begin + lVar29);
          lVar13 = plVar1[1];
          puVar2 = (undefined8 *)((long)&pvVar26->end_array + lVar29);
          pwVar18 = (wclass *)*puVar2;
          sVar7 = puVar2[1];
          (peVar4->l).multi = *plVar1;
          (peVar4->l).cs.costs._end = (wclass *)lVar13;
          (peVar4->l).cs.costs.end_array = pwVar18;
          (peVar4->l).cs.costs.erase_count = sVar7;
          (peVar4->pred).scalar = fVar21;
          uVar27 = uVar27 + 1;
          ppeVar25 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                     super__Vector_impl_data._M_start;
          lVar29 = lVar29 + 0x20;
        } while (uVar27 < (ulong)((long)(ec_seq->
                                        super__Vector_base<example_*,_std::allocator<example_*>_>).
                                        _M_impl.super__Vector_impl_data._M_finish - (long)ppeVar25
                                 >> 3));
      }
      return;
    }
    if ((float)pvVar26->_begin->class_index == fVar21) {
      fVar31 = pvVar26->_begin->x;
      goto LAB_001c544a;
    }
    pvVar26 = pvVar26 + 1;
  } while( true );
}

Assistant:

void do_actual_learning_ldf(cbify& data, multi_learner& base, multi_ex& ec_seq)
{
  // change label and pred data for cb
  if (data.cs_costs.size() < ec_seq.size())
    data.cs_costs.resize(ec_seq.size());
  if (data.cb_costs.size() < ec_seq.size())
    data.cb_costs.resize(ec_seq.size());
  if (data.cb_as.size() < ec_seq.size())
    data.cb_as.resize(ec_seq.size());
  for (size_t i = 0; i < ec_seq.size(); ++i)
  {
    auto& ec = *ec_seq[i];
    data.cs_costs[i] = ec.l.cs.costs;
    data.cb_costs[i].clear();
    data.cb_as[i].clear();
    ec.l.cb.costs = data.cb_costs[i];
    ec.pred.a_s = data.cb_as[i];
  }

  base.predict(ec_seq);

  auto& out_ec = *ec_seq[0];

  uint32_t chosen_action;
  if (sample_after_normalizing(data.app_seed + data.example_counter++, begin_scores(out_ec.pred.a_s), end_scores(out_ec.pred.a_s), chosen_action))
    THROW("Failed to sample from pdf");

  CB::cb_class cl;
  cl.action = out_ec.pred.a_s[chosen_action].action + 1;
  cl.probability = out_ec.pred.a_s[chosen_action].score;

  if(!cl.action)
    THROW("No action with non-zero probability found!");

  cl.cost = loss_csldf(data, data.cs_costs, cl.action);

  // add cb label to chosen action
  data.cb_label.costs.clear();
  data.cb_label.costs.push_back(cl);
  data.cb_costs[cl.action-1] = ec_seq[cl.action-1]->l.cb.costs;
  ec_seq[cl.action - 1]->l.cb = data.cb_label;

  base.learn(ec_seq);

  // set cs prediction and reset cs costs
  for (size_t i = 0; i < ec_seq.size(); ++i)
  {
    auto& ec = *ec_seq[i];
    data.cb_as[i]=ec.pred.a_s;//store action_score vector for later reuse.
    if (i == cl.action -1 )
      data.cb_label = ec.l.cb;
    else
      data.cb_costs[i] = ec.l.cb.costs;
    ec.l.cs.costs = data.cs_costs[i];
    if (i == cl.action - 1)
      ec.pred.multiclass = cl.action;
    else
      ec.pred.multiclass = 0;
  }
}